

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruckig.hpp
# Opt level: O2

bool __thiscall
ruckig::Ruckig<1UL,_ruckig::StandardVector,_true>::validate_input<true>
          (Ruckig<1UL,_ruckig::StandardVector,_true> *this,
          InputParameter<1UL,_ruckig::StandardVector> *input,bool check_current_state_within_limits,
          bool check_target_state_within_limits)

{
  pointer paVar1;
  pointer paVar2;
  bool bVar3;
  RuckigError *pRVar4;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar3 = InputParameter<1UL,_ruckig::StandardVector>::validate<true>
                    (input,check_current_state_within_limits,check_target_state_within_limits);
  if (bVar3) {
    paVar1 = (input->intermediate_positions).
             super__Vector_base<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    paVar2 = (input->intermediate_positions).
             super__Vector_base<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (((paVar1 != paVar2) && (input->control_interface == Position)) &&
       (this->max_number_of_waypoints < (ulong)((long)paVar2 - (long)paVar1 >> 3))) {
      pRVar4 = (RuckigError *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string
                (&local_60,
                 (long)(input->intermediate_positions).
                       super__Vector_base<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(input->intermediate_positions).
                       super__Vector_base<std::array<double,_1UL>,_std::allocator<std::array<double,_1UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      std::operator+(&local_40,"The number of intermediate positions ",&local_60);
      std::operator+(&local_e0,&local_40," exceeds the maximum number of waypoints ");
      std::__cxx11::to_string(&local_80,this->max_number_of_waypoints);
      std::operator+(&local_c0,&local_e0,&local_80);
      std::operator+(&local_a0,&local_c0,".");
      RuckigError::RuckigError(pRVar4,&local_a0);
      __cxa_throw(pRVar4,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((this->delta_time <= 0.0) && (input->duration_discretization != Continuous)) {
      pRVar4 = (RuckigError *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_e0,this->delta_time);
      std::operator+(&local_c0,"delta time (control rate) parameter ",&local_e0);
      std::operator+(&local_a0,&local_c0," should be larger than zero.");
      RuckigError::RuckigError(pRVar4,&local_a0);
      __cxa_throw(pRVar4,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return bVar3;
}

Assistant:

bool validate_input(const InputParameter<DOFs, CustomVector>& input, bool check_current_state_within_limits = false, bool check_target_state_within_limits = true) const {
        if (!input.template validate<throw_validation_error>(check_current_state_within_limits, check_target_state_within_limits)) {
            return false;
        }

        if (!input.intermediate_positions.empty() && input.control_interface == ControlInterface::Position) {
            if (input.intermediate_positions.size() > max_number_of_waypoints) {
                if constexpr (throw_validation_error) {
                    throw RuckigError("The number of intermediate positions " + std::to_string(input.intermediate_positions.size()) + " exceeds the maximum number of waypoints " + std::to_string(max_number_of_waypoints) + ".");
                }
                return false;
            }
        }

        if (delta_time <= 0.0 && input.duration_discretization != DurationDiscretization::Continuous) {
            if constexpr (throw_validation_error) {
                throw RuckigError("delta time (control rate) parameter " + std::to_string(delta_time) + " should be larger than zero.");
            }
            return false;
        }

        return true;
    }